

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::Impl::analyze_instructions(Impl *this,Function *func)

{
  BasicBlock *pBVar1;
  Instruction *pIVar2;
  iterator iVar3;
  undefined8 uVar4;
  bool bVar5;
  ValueKind VVar6;
  int iVar7;
  __normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  _Var8;
  __normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  _Var9;
  __normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
  _Var10;
  IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
  IVar11;
  Instruction *pIVar12;
  Value *pVVar13;
  PHINode *inst;
  AtomicRMWInst *inst_00;
  AtomicCmpXchgInst *inst_01;
  AllocaInst *inst_02;
  GetElementPtrInst *inst_03;
  ExtractValueInst *inst_04;
  CmpInst *inst_05;
  CallInst *pCVar14;
  Function *pFVar15;
  String *pSVar16;
  Type *pTVar17;
  __node_base *p_Var18;
  Instruction **ppIVar19;
  Instruction *pIVar20;
  Vector<const_LLVMBC::Instruction_*> precise_instructions;
  Vector<LLVMBC::BasicBlock_*> visit_order;
  Instruction **local_88;
  iterator iStack_80;
  Instruction **local_78;
  undefined1 local_68 [56];
  
  if (((func != (Function *)0x0) && ((this->options).propagate_precise == true)) &&
     ((this->options).force_precise == false)) {
    local_88 = (Instruction **)0x0;
    iStack_80._M_current = (Instruction **)0x0;
    local_78 = (Instruction **)0x0;
    _Var8._M_current = (BasicBlock **)LLVMBC::Function::begin(func);
    _Var9._M_current = (BasicBlock **)LLVMBC::Function::end(func);
    if (_Var8._M_current != _Var9._M_current) {
      do {
        pBVar1 = *_Var8._M_current;
        _Var10._M_current = (Instruction **)LLVMBC::BasicBlock::begin(pBVar1);
        IVar11 = LLVMBC::BasicBlock::end(pBVar1);
        for (; (__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
                )_Var10._M_current != IVar11.iter._M_current;
            _Var10._M_current = _Var10._M_current + 1) {
          pIVar20 = *_Var10._M_current;
          bVar5 = instruction_requires_no_contraction(pIVar20);
          if (bVar5) {
            local_68._0_8_ = pIVar20;
            if (iStack_80._M_current == local_78) {
              std::
              vector<LLVMBC::Instruction_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_const*>>
              ::_M_realloc_insert<LLVMBC::Instruction_const*>
                        ((vector<LLVMBC::Instruction_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_const*>>
                          *)&local_88,iStack_80,(Instruction **)local_68);
            }
            else {
              *iStack_80._M_current = pIVar20;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
        }
        _Var8._M_current = _Var8._M_current + 1;
      } while (_Var8._M_current != _Var9._M_current);
    }
    iVar3._M_current = iStack_80._M_current;
    local_68._0_8_ = local_68 + 0x30;
    local_68._8_8_ = (Instruction *)0x1;
    local_68._16_8_ = (_Hash_node_base *)0x0;
    local_68._24_8_ = 0;
    local_68._32_4_ = 1.0;
    local_68._40_8_ = 0;
    local_68._48_8_ = (__node_base_ptr)0x0;
    if (local_88 != iStack_80._M_current) {
      ppIVar19 = local_88;
      do {
        propagate_precise((UnorderedSet<const_LLVMBC::Instruction_*> *)local_68,*ppIVar19);
        ppIVar19 = ppIVar19 + 1;
      } while (ppIVar19 != iVar3._M_current);
    }
    std::
    _Hashtable<const_LLVMBC::Instruction_*,_const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Instruction_*>,_std::hash<const_LLVMBC::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<const_LLVMBC::Instruction_*,_const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Instruction_*>,_std::hash<const_LLVMBC::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_68);
    if (local_88 != (Instruction **)0x0) {
      free_in_thread(local_88);
    }
  }
  build_function_bb_visit_order_analysis((Vector<LLVMBC::BasicBlock_*> *)local_68,this,func);
  uVar4 = local_68._8_8_;
  pIVar12 = (Instruction *)local_68._8_8_;
  for (pIVar20 = (Instruction *)local_68._0_8_; pIVar2 = (Instruction *)local_68._0_8_,
      local_68._8_8_ = pIVar12, pIVar20 != (Instruction *)uVar4;
      pIVar20 = (Instruction *)&(pIVar20->super_Value).kind) {
    pBVar1 = (BasicBlock *)(pIVar20->super_Value).type;
    if ((this->options).eliminate_dead_code == true) {
      pIVar12 = LLVMBC::BasicBlock::getTerminator(pBVar1);
      mark_used_values(this,pIVar12);
    }
    _Var10._M_current = (Instruction **)LLVMBC::BasicBlock::begin(pBVar1);
    IVar11 = LLVMBC::BasicBlock::end(pBVar1);
    for (; (__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
            )_Var10._M_current != IVar11.iter._M_current; _Var10._M_current = _Var10._M_current + 1)
    {
      pIVar12 = *_Var10._M_current;
      if ((this->options).eliminate_dead_code == true) {
        mark_used_values(this,pIVar12);
      }
      if (pIVar12 == (Instruction *)0x0) {
LAB_001273f9:
        pVVar13 = (Value *)0x0;
      }
      else {
        pVVar13 = LLVMBC::Internal::resolve_proxy(&pIVar12->super_Value);
        VVar6 = LLVMBC::Value::get_value_kind(pVVar13);
        if (VVar6 != Load) goto LAB_001273f9;
      }
      if (pVVar13 == (Value *)0x0) {
        if (pIVar12 == (Instruction *)0x0) {
LAB_0012742e:
          inst = (PHINode *)0x0;
        }
        else {
          inst = (PHINode *)LLVMBC::Internal::resolve_proxy(&pIVar12->super_Value);
          VVar6 = LLVMBC::Value::get_value_kind((Value *)inst);
          if (VVar6 != PHI) goto LAB_0012742e;
        }
        if (inst != (PHINode *)0x0) {
          bVar5 = analyze_phi_instruction(this,inst);
          goto LAB_001275b4;
        }
        if (pIVar12 == (Instruction *)0x0) {
LAB_00127463:
          pVVar13 = (Value *)0x0;
        }
        else {
          pVVar13 = LLVMBC::Internal::resolve_proxy(&pIVar12->super_Value);
          VVar6 = LLVMBC::Value::get_value_kind(pVVar13);
          if (VVar6 != Store) goto LAB_00127463;
        }
        if (pVVar13 != (Value *)0x0) {
          bVar5 = analyze_store_instruction(this,(StoreInst *)pVVar13);
          goto LAB_001275b4;
        }
        if (pIVar12 == (Instruction *)0x0) {
LAB_00127498:
          inst_00 = (AtomicRMWInst *)0x0;
        }
        else {
          inst_00 = (AtomicRMWInst *)LLVMBC::Internal::resolve_proxy(&pIVar12->super_Value);
          VVar6 = LLVMBC::Value::get_value_kind((Value *)inst_00);
          if (VVar6 != AtomicRMW) goto LAB_00127498;
        }
        if (inst_00 != (AtomicRMWInst *)0x0) {
          bVar5 = analyze_atomicrmw_instruction(this,inst_00);
          goto LAB_001275b4;
        }
        if (pIVar12 == (Instruction *)0x0) {
LAB_001274cd:
          inst_01 = (AtomicCmpXchgInst *)0x0;
        }
        else {
          inst_01 = (AtomicCmpXchgInst *)LLVMBC::Internal::resolve_proxy(&pIVar12->super_Value);
          VVar6 = LLVMBC::Value::get_value_kind((Value *)inst_01);
          if (VVar6 != AtomicCmpXchg) goto LAB_001274cd;
        }
        if (inst_01 != (AtomicCmpXchgInst *)0x0) {
          bVar5 = analyze_cmpxchg_instruction(this,inst_01);
          goto LAB_001275b4;
        }
        if (pIVar12 == (Instruction *)0x0) {
LAB_00127502:
          inst_02 = (AllocaInst *)0x0;
        }
        else {
          inst_02 = (AllocaInst *)LLVMBC::Internal::resolve_proxy(&pIVar12->super_Value);
          VVar6 = LLVMBC::Value::get_value_kind((Value *)inst_02);
          if (VVar6 != Alloca) goto LAB_00127502;
        }
        if (inst_02 != (AllocaInst *)0x0) {
          bVar5 = analyze_alloca_instruction(this,inst_02);
          goto LAB_001275b4;
        }
        if (pIVar12 == (Instruction *)0x0) {
LAB_00127537:
          inst_03 = (GetElementPtrInst *)0x0;
        }
        else {
          inst_03 = (GetElementPtrInst *)LLVMBC::Internal::resolve_proxy(&pIVar12->super_Value);
          VVar6 = LLVMBC::Value::get_value_kind((Value *)inst_03);
          if (VVar6 != GetElementPtr) goto LAB_00127537;
        }
        if (inst_03 != (GetElementPtrInst *)0x0) {
          bVar5 = analyze_getelementptr_instruction(this,inst_03);
          goto LAB_001275b4;
        }
        if (pIVar12 == (Instruction *)0x0) {
LAB_00127569:
          inst_04 = (ExtractValueInst *)0x0;
        }
        else {
          inst_04 = (ExtractValueInst *)LLVMBC::Internal::resolve_proxy(&pIVar12->super_Value);
          VVar6 = LLVMBC::Value::get_value_kind((Value *)inst_04);
          if (VVar6 != ExtractValue) goto LAB_00127569;
        }
        if (inst_04 != (ExtractValueInst *)0x0) {
          bVar5 = analyze_extractvalue_instruction(this,inst_04);
          goto LAB_001275b4;
        }
        if (pIVar12 == (Instruction *)0x0) {
LAB_001275a1:
          inst_05 = (CmpInst *)0x0;
        }
        else {
          inst_05 = (CmpInst *)LLVMBC::Internal::resolve_proxy(&pIVar12->super_Value);
          VVar6 = LLVMBC::Value::get_value_kind((Value *)inst_05);
          bVar5 = LLVMBC::CmpInst::is_base_of_value_kind(VVar6);
          if (!bVar5) goto LAB_001275a1;
        }
        if (inst_05 != (CmpInst *)0x0) {
          bVar5 = analyze_compare_instruction(this,inst_05);
          goto LAB_001275b4;
        }
        if (pIVar12 == (Instruction *)0x0) {
LAB_001275e8:
          pCVar14 = (CallInst *)0x0;
        }
        else {
          pCVar14 = (CallInst *)LLVMBC::Internal::resolve_proxy(&pIVar12->super_Value);
          VVar6 = LLVMBC::Value::get_value_kind((Value *)pCVar14);
          if (VVar6 != Call) goto LAB_001275e8;
        }
        if (pCVar14 != (CallInst *)0x0) {
          pFVar15 = LLVMBC::CallInst::getCalledFunction(pCVar14);
          pSVar16 = LLVMBC::Function::getName_abi_cxx11_(pFVar15);
          iVar7 = strncmp((pSVar16->_M_dataplus)._M_p,"dx.op",5);
          if (iVar7 == 0) {
            bVar5 = analyze_dxil_instruction(this,pCVar14,pBVar1);
            goto LAB_001275b4;
          }
        }
      }
      else {
        bVar5 = analyze_load_instruction(this,(LoadInst *)pVVar13);
LAB_001275b4:
        if (bVar5 == false) goto LAB_0012773e;
      }
    }
    (this->ags).current_phase = 0;
    (this->ags).num_instructions = 0;
    (this->ags).active_read_backdoor = (Value *)0x0;
    pIVar12 = (Instruction *)local_68._8_8_;
  }
  for (; pIVar2 != pIVar12; pIVar2 = (Instruction *)&(pIVar2->super_Value).kind) {
    pBVar1 = (BasicBlock *)(pIVar2->super_Value).type;
    _Var10._M_current = (Instruction **)LLVMBC::BasicBlock::begin(pBVar1);
    IVar11 = LLVMBC::BasicBlock::end(pBVar1);
    for (; (__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
            )_Var10._M_current != IVar11.iter._M_current; _Var10._M_current = _Var10._M_current + 1)
    {
      if (*_Var10._M_current == (Instruction *)0x0) {
LAB_001276a1:
        pCVar14 = (CallInst *)0x0;
      }
      else {
        pCVar14 = (CallInst *)LLVMBC::Internal::resolve_proxy(&(*_Var10._M_current)->super_Value);
        VVar6 = LLVMBC::Value::get_value_kind((Value *)pCVar14);
        if (VVar6 != Call) goto LAB_001276a1;
      }
      if (pCVar14 != (CallInst *)0x0) {
        pFVar15 = LLVMBC::CallInst::getCalledFunction(pCVar14);
        pSVar16 = LLVMBC::Function::getName_abi_cxx11_(pFVar15);
        iVar7 = strncmp((pSVar16->_M_dataplus)._M_p,"dx.op",5);
        if ((iVar7 == 0) && (bVar5 = analyze_dxil_buffer_access_instruction(this,pCVar14), !bVar5))
        goto LAB_0012773e;
      }
    }
    (this->ags).current_phase = 0;
    (this->ags).num_instructions = 0;
    (this->ags).active_read_backdoor = (Value *)0x0;
  }
  p_Var18 = &(this->alloca_tracking)._M_h._M_before_begin;
  do {
    p_Var18 = p_Var18->_M_nxt;
    if (p_Var18 == (__node_base *)0x0) {
      std::
      _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(this->ags).coopmat_component_mapping._M_h);
      bVar5 = true;
      goto LAB_00127740;
    }
    pTVar17 = LLVMBC::Value::getType((Value *)p_Var18[1]._M_nxt);
    pTVar17 = LLVMBC::Type::getPointerElementType(pTVar17);
    pTVar17 = LLVMBC::Type::getArrayElementType(pTVar17);
    bVar5 = analyze_alloca_cbv_forwarding_pre_resource_emit
                      (this,pTVar17,(AllocaCBVForwardingTracking *)(p_Var18 + 2));
  } while (bVar5);
LAB_0012773e:
  bVar5 = false;
LAB_00127740:
  if ((Instruction *)local_68._0_8_ != (Instruction *)0x0) {
    free_in_thread((void *)local_68._0_8_);
  }
  return bVar5;
}

Assistant:

bool Converter::Impl::analyze_instructions(llvm::Function *func)
{
	// Need to analyze this in two stages.
	// In the first stage, we need to analyze:
	// - Load/GetElementPtr to handle lib global variables
	// - CreateHandle family to build LLVM access handles
	// - ExtractValue to track which components are used for BufferLoad.
	// In the second phase we analyze the buffer loads and stores and figure out
	// alignments of the loads and stores. This lets us build up a list of SSBO declarations we need to
	// optimally implement the loads and stores. We need to do this late, because we depend on results
	// of ExtractValue analysis.

	if (func && options.propagate_precise && !options.force_precise)
		propagate_precise(func);

	auto visit_order = build_function_bb_visit_order_analysis(func);

	for (auto *bb : visit_order)
	{
		if (options.eliminate_dead_code)
			mark_used_values(bb->getTerminator());

		for (auto &inst : *bb)
		{
			if (options.eliminate_dead_code)
				mark_used_values(&inst);

			if (auto *load_inst = llvm::dyn_cast<llvm::LoadInst>(&inst))
			{
				if (!analyze_load_instruction(*this, load_inst))
					return false;
			}
			else if (auto *phi_inst = llvm::dyn_cast<llvm::PHINode>(&inst))
			{
				if (!analyze_phi_instruction(*this, phi_inst))
					return false;
			}
			else if (auto *store_inst = llvm::dyn_cast<llvm::StoreInst>(&inst))
			{
				if (!analyze_store_instruction(*this, store_inst))
					return false;
			}
			else if (auto *atomicrmw_inst = llvm::dyn_cast<llvm::AtomicRMWInst>(&inst))
			{
				if (!analyze_atomicrmw_instruction(*this, atomicrmw_inst))
					return false;
			}
			else if (auto *cmpxchg_inst = llvm::dyn_cast<llvm::AtomicCmpXchgInst>(&inst))
			{
				if (!analyze_cmpxchg_instruction(*this, cmpxchg_inst))
					return false;
			}
			else if (auto *alloca_inst = llvm::dyn_cast<llvm::AllocaInst>(&inst))
			{
				if (!analyze_alloca_instruction(*this, alloca_inst))
					return false;
			}
			else if (auto *getelementptr_inst = llvm::dyn_cast<llvm::GetElementPtrInst>(&inst))
			{
				if (!analyze_getelementptr_instruction(*this, getelementptr_inst))
					return false;
			}
			else if (auto *extractvalue_inst = llvm::dyn_cast<llvm::ExtractValueInst>(&inst))
			{
				if (!analyze_extractvalue_instruction(*this, extractvalue_inst))
					return false;
			}
			else if (auto *cmp_inst = llvm::dyn_cast<llvm::CmpInst>(&inst))
			{
				if (!analyze_compare_instruction(*this, cmp_inst))
					return false;
			}
			else if (auto *call_inst = llvm::dyn_cast<llvm::CallInst>(&inst))
			{
				auto *called_function = call_inst->getCalledFunction();
				if (strncmp(called_function->getName().data(), "dx.op", 5) == 0)
				{
					if (!analyze_dxil_instruction(*this, call_inst, bb))
						return false;
				}
			}
		}

		// Reset AGS tracking for every BB.
		ags.reset();
	}

	for (auto *bb : visit_order)
	{
		for (auto &inst : *bb)
		{
			if (auto *call_inst = llvm::dyn_cast<llvm::CallInst>(&inst))
			{
				auto *called_function = call_inst->getCalledFunction();
				if (strncmp(called_function->getName().data(), "dx.op", 5) == 0)
				{
					if (!analyze_dxil_buffer_access_instruction(*this, call_inst))
						return false;
				}
			}
		}

		// Reset AGS tracking for every BB.
		ags.reset();
	}

	for (auto &alloc : alloca_tracking)
	{
		// Mark required resource aliases before we emit resources. Defer some work until after resource creation.
		const auto *scalar_type =
		    alloc.first->getType()->getPointerElementType()->getArrayElementType();
		if (!analyze_alloca_cbv_forwarding_pre_resource_emit(*this, scalar_type, alloc.second))
			return false;
	}

	ags.reset_analysis();

	return true;
}